

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxgeometsc.hpp
# Opt level: O2

double soplex::computeScalingVec<double>
                 (SVSetBase<double> *vecset,vector<double,_std::allocator<double>_> *coScaleval,
                 vector<double,_std::allocator<double>_> *scaleval,double epsilon)

{
  int iVar1;
  uint uVar2;
  Item *pIVar3;
  Nonzero<double> *pNVar4;
  double *pdVar5;
  ulong uVar6;
  long lVar7;
  int i;
  long lVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  dVar9 = 0.0;
  for (lVar8 = 0; lVar8 < (vecset->set).thenum; lVar8 = lVar8 + 1) {
    pIVar3 = (vecset->set).theitem;
    iVar1 = (vecset->set).thekey[lVar8].idx;
    pdVar5 = (double *)infinity();
    dVar11 = *pdVar5;
    uVar2 = pIVar3[iVar1].data.super_SVectorBase<double>.memused;
    uVar6 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar6 = 0;
    }
    dVar13 = 0.0;
    for (lVar7 = 0; uVar6 * 0x10 != lVar7; lVar7 = lVar7 + 0x10) {
      pNVar4 = pIVar3[iVar1].data.super_SVectorBase<double>.m_elem;
      dVar12 = ABS(*(double *)((long)&pNVar4->val + lVar7) *
                   (coScaleval->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[*(uint *)((long)&pNVar4->idx + lVar7)]);
      if (epsilon < dVar12) {
        dVar10 = dVar12;
        if (dVar12 <= dVar13) {
          dVar10 = dVar13;
        }
        dVar13 = dVar10;
        if (dVar12 < dVar11) {
          dVar11 = dVar12;
        }
      }
    }
    pdVar5 = (double *)infinity();
    dVar12 = 1.0;
    dVar10 = 1.0;
    if (*pdVar5 != dVar11 && dVar13 != 0.0) {
      dVar12 = dVar13;
      dVar10 = dVar11;
    }
    dVar11 = dVar10 * dVar12;
    if (dVar11 < 0.0) {
      dVar11 = sqrt(dVar11);
    }
    else {
      dVar11 = SQRT(dVar11);
    }
    (scaleval->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_start[lVar8] = 1.0 / dVar11;
    dVar11 = dVar12 / dVar10;
    if (dVar12 / dVar10 <= dVar9) {
      dVar11 = dVar9;
    }
    dVar9 = dVar11;
  }
  return dVar9;
}

Assistant:

static R computeScalingVec(
   const SVSetBase<R>*   vecset, const std::vector<R>& coScaleval,
   std::vector<R>&       scaleval, R epsilon)
{
   R pmax = 0.0;

   assert(scaleval.size() == unsigned(vecset->num()));

   for(int i = 0; i < vecset->num(); ++i)
   {
      const SVectorBase<R>& vec = (*vecset)[i];

      R maxi = 0.0;
      R mini = R(infinity);

      for(int j = 0; j < vec.size(); ++j)
      {
         const R x = spxAbs(vec.value(j) * coScaleval[unsigned(vec.index(j))]);

         if(!isZero(x, epsilon))
         {
            if(x > maxi)
               maxi = x;

            if(x < mini)
               mini = x;
         }
      }

      // empty rows/cols are possible
      if(mini == R(infinity) || maxi == 0.0)
      {
         mini = 1.0;
         maxi = 1.0;
      }

      assert(mini < R(infinity));
      assert(maxi > 0.0);

      scaleval[unsigned(i)] = 1.0 / spxSqrt(mini * maxi);

      const R p = maxi / mini;

      if(p > pmax)
         pmax = p;
   }

   return pmax;
}